

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

uint32 gflags::Uint32FromEnv(char *v,uint32 dflt)

{
  bool bVar1;
  char *__s;
  uint32 *puVar2;
  FlagValue ifv;
  string valstr;
  FlagValue local_50;
  char *local_40;
  undefined8 local_38;
  char local_30 [16];
  
  local_38 = 0;
  local_30[0] = '\0';
  local_40 = local_30;
  __s = getenv(v);
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)__s);
    puVar2 = (uint32 *)operator_new(4);
    local_50.type_ = '\x02';
    local_50.owns_value_ = true;
    local_50.value_buffer_ = puVar2;
    bVar1 = anon_unknown_2::FlagValue::ParseFrom(&local_50,local_40);
    if (!bVar1) {
      anon_unknown_2::ReportError
                (DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",v,local_40);
    }
    dflt = *puVar2;
    anon_unknown_2::FlagValue::~FlagValue(&local_50);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return dflt;
}

Assistant:

uint32 Uint32FromEnv(const char *v, uint32 dflt) {
  return GetFromEnv(v, dflt);
}